

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcShapeModel::IfcShapeModel(IfcShapeModel *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  pp_Var1 = (_func_int **)vtt[2];
  (this->super_IfcRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcRepresentation).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[3];
  (this->super_IfcRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IfcRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcRepresentation).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[4];
  *(undefined8 *)
   &(this->super_IfcRepresentation).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x10 = 0;
  *(undefined1 **)
   &(this->super_IfcRepresentation).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x18 =
       &(this->super_IfcRepresentation).field_0x28;
  *(undefined8 *)
   &(this->super_IfcRepresentation).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x20 = 0;
  (this->super_IfcRepresentation).field_0x28 = 0;
  (this->super_IfcRepresentation).field_0x38 = 0;
  (this->super_IfcRepresentation).RepresentationType.ptr._M_dataplus._M_p =
       (pointer)&(this->super_IfcRepresentation).RepresentationType.ptr.field_2;
  (this->super_IfcRepresentation).RepresentationType.ptr._M_string_length = 0;
  (this->super_IfcRepresentation).RepresentationType.ptr.field_2._M_local_buf[0] = '\0';
  (this->super_IfcRepresentation).RepresentationType.have = false;
  (this->super_IfcRepresentation).Items.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IfcRepresentation).Items.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IfcRepresentation).Items.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = vtt[5];
  *(void **)&(this->super_IfcRepresentation).field_0x80 = pvVar2;
  *(void **)(&(this->super_IfcRepresentation).field_0x80 + *(long *)((long)pvVar2 + -0x18)) = vtt[6]
  ;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_IfcRepresentation).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[7];
  *(void **)&(this->super_IfcRepresentation).field_0x80 = vtt[8];
  return;
}

Assistant:

ObjectHelper()
        : aux_is_derived(0) {
            // empty
        }